

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

bool IsOpSuccess(opcodetype *opcode)

{
  opcodetype oVar1;
  long in_FS_OFFSET;
  bool bVar2;
  
  oVar1 = *opcode;
  bVar2 = true;
  if (((0x37 < oVar1 - OP_VER) || ((0xf8199ef0000001U >> ((ulong)(oVar1 - OP_VER) & 0x3f) & 1) == 0)
      ) && (oVar1 != OP_RESERVED)) {
    bVar2 = oVar1 + ~OP_CHECKSIGADD < 0x44;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsOpSuccess(const opcodetype& opcode)
{
    return opcode == 80 || opcode == 98 || (opcode >= 126 && opcode <= 129) ||
           (opcode >= 131 && opcode <= 134) || (opcode >= 137 && opcode <= 138) ||
           (opcode >= 141 && opcode <= 142) || (opcode >= 149 && opcode <= 153) ||
           (opcode >= 187 && opcode <= 254);
}